

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O0

int __thiscall
QGraphicsDropShadowEffect::qt_metacall(QGraphicsDropShadowEffect *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QGraphicsEffect::qt_metacall
                    ((QGraphicsEffect *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),
                     (int)in_RCX,in_RDI);
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 10) {
        qt_static_metacall((QObject *)this,_c,_id,_a);
      }
      iVar1 = iVar1 + -10;
    }
    if (in_ESI == 7) {
      if (iVar1 < 10) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      iVar1 = iVar1 + -10;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall((QObject *)this,_c,_id,_a);
      iVar1 = iVar1 + -5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int QGraphicsDropShadowEffect::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QGraphicsEffect::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 10)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 10;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 10)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 10;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    return _id;
}